

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_create_unique_name_Test::
NameCacheTests_test_create_unique_name_Test(NameCacheTests_test_create_unique_name_Test *this)

{
  NameCacheTests::NameCacheTests(&this->super_NameCacheTests);
  (this->super_NameCacheTests).super_Test._vptr_Test = (_func_int **)&PTR__NameCacheTests_002778a0;
  return;
}

Assistant:

TEST_F(NameCacheTests, test_create_unique_name)
{
    EXPECT_EQ("Test1", name_cache_.CreateUniqueName("Test"));
    EXPECT_EQ("Test2", name_cache_.CreateUniqueName("Test"));
    EXPECT_EQ("Test3", name_cache_.CreateUniqueName("Test"));
    EXPECT_EQ("Client1", name_cache_.CreateUniqueName("Client"));
    EXPECT_EQ("File.1", name_cache_.CreateUniqueName("File."));
    EXPECT_EQ("File.2", name_cache_.CreateUniqueName("File."));
    EXPECT_EQ("File.3", name_cache_.CreateUniqueName("File."));
}